

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::R32UIImageSingleValueVerifier::operator()
          (R32UIImageSingleValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int param_3)

{
  deUint32 *value;
  deUint32 dVar1;
  deUint32 dVar2;
  bool bVar3;
  bool bVar4;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  local_1b0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"// Note: expecting to get value ");
  value = &this->m_min;
  dVar1 = this->m_min;
  dVar2 = this->m_max;
  if (dVar1 == dVar2) {
    de::toString<unsigned_int>(&local_270,value);
  }
  else {
    de::toString<unsigned_int>(&local_230,value);
    std::operator+(&local_210,"in range [",&local_230);
    std::operator+(&local_1f0,&local_210,", ");
    de::toString<unsigned_int>(&local_250,&this->m_max);
    std::operator+(&local_1d0,&local_1f0,&local_250);
    std::operator+(&local_270,&local_1d0,"]");
  }
  std::operator<<(&local_1a8,(string *)&local_270);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_270);
  if (dVar1 != dVar2) {
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  tcu::ConstPixelBufferAccess::getPixelUint
            ((ConstPixelBufferAccess *)local_1b0,(int)resultSlice,0,0);
  bVar3 = *value <= (uint)local_1b0._0_4_;
  bVar4 = (uint)local_1b0._0_4_ <= this->m_max;
  if (bVar4 && bVar3) {
    local_1b0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"// Success: got value ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"// Failure: got value ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return bVar4 && bVar3;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int) const
	{
		DE_ASSERT(resultSlice.getWidth() == 1 && resultSlice.getHeight() == 1 && resultSlice.getDepth() == 1);
		DE_ASSERT(resultSlice.getFormat() == TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32));

		log << TestLog::Message << "// Note: expecting to get value " << (m_min == m_max ? toString(m_min) : "in range [" + toString(m_min) + ", " + toString(m_max) + "]") << TestLog::EndMessage;

		const deUint32 resultValue = resultSlice.getPixelUint(0, 0).x();
		if (!de::inRange(resultValue, m_min, m_max))
		{
			log << TestLog::Message << "// Failure: got value " << resultValue << TestLog::EndMessage;
			return false;
		}
		else
		{
			log << TestLog::Message << "// Success: got value " << resultValue << TestLog::EndMessage;
			return true;
		}
	}